

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_runner_platform.c
# Opt level: O2

void run_test_in_its_own_process(TestSuite *suite,CgreenTest *test,TestReporter *reporter)

{
  int iVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  __pid_t _Var4;
  uint32_t end_time_in_milliseconds;
  char *pcVar5;
  char *pcVar6;
  uint __sig;
  char buf [128];
  
  pcVar6 = buf;
  uVar3 = cgreen_time_get_current_milliseconds();
  (*reporter->start_test)(reporter,test->name);
  if (test->skip != 0) {
    send_reporter_skipped_notification(reporter);
    (*reporter->finish_test)(reporter,test->filename,test->line,(char *)0x0);
    return;
  }
  fflush((FILE *)0x0);
  _Var4 = fork();
  if (-1 < _Var4) {
    if (_Var4 != 0) goto LAB_0010deb0;
    run_the_test_code(suite,test,reporter);
    send_reporter_completion_notification(reporter);
    stop();
  }
  die("Could not fork process\n");
LAB_0010deb0:
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  signal(2,(__sighandler_t)0x1);
  wait(buf);
  signal(2,(__sighandler_t)0x0);
  uVar2 = buf._0_4_;
  end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
  uVar3 = cgreen_time_duration_in_milliseconds(uVar3,end_time_in_milliseconds);
  reporter->duration = uVar3;
  __sig = uVar2 & 0x7f;
  if ((__sig == 6) || ((int)(__sig * 0x1000000 + 0x1000000) < 0x2000000)) {
    pcVar5 = test->filename;
    iVar1 = test->line;
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar5 = strsignal(__sig);
    __snprintf_chk(buf,0x80,1,0x80,"Test terminated with signal: %s",pcVar5);
    pcVar5 = test->filename;
    iVar1 = test->line;
  }
  (*reporter->finish_test)(reporter,pcVar5,iVar1,pcVar6);
  return;
}

Assistant:

void run_test_in_its_own_process(TestSuite *suite, CgreenTest *test, TestReporter *reporter) {
    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_test)(reporter, test->name);
    if (test->skip) {
        send_reporter_skipped_notification(reporter);
        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    } else if (in_child_process()) {
        run_the_test_code(suite, test, reporter);
        send_reporter_completion_notification(reporter);
        stop();
    } else {
        const int status = wait_for_child_process();
        reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                                      cgreen_time_get_current_milliseconds());
        if (WIFSIGNALED(status)) {
            /* a C++ exception generates SIGABRT. Only print our special message for other signals. */
            const int sig = WTERMSIG(status);
            if (sig != SIGABRT) {
                char buf[128];
                snprintf(buf, sizeof(buf), "Test terminated with signal: %s", (const char *)strsignal(sig));
                (*reporter->finish_test)(reporter, test->filename, test->line, buf);
                return;
            }
        }

        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    }
}